

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

char * Dau_DsdPerform(word t)

{
  int *pMatches;
  int local_2c;
  int iStack_28;
  int Pos;
  int pVarsNew [6];
  word t_local;
  
  _iStack_28 = 0x100000000;
  pVarsNew[0] = 2;
  pVarsNew[1] = 3;
  pVarsNew[2] = 4;
  pVarsNew[3] = 5;
  pVarsNew._16_8_ = t;
  if (t == 0) {
    local_2c = 1;
    Dau_DsdPerform::pBuffer[0] = '0';
  }
  else if (t == 0xffffffffffffffff) {
    local_2c = 1;
    Dau_DsdPerform::pBuffer[0] = '1';
  }
  else {
    local_2c = Dau_DsdPerform_rec(t,Dau_DsdPerform::pBuffer,0,&iStack_28,6);
  }
  Dau_DsdPerform::pBuffer[local_2c] = '\0';
  pMatches = Dau_DsdComputeMatches(Dau_DsdPerform::pBuffer);
  Dau_DsdRemoveBraces(Dau_DsdPerform::pBuffer,pMatches);
  return Dau_DsdPerform::pBuffer;
}

Assistant:

char * Dau_DsdPerform( word t )
{
    static char pBuffer[DAU_MAX_STR];
    int pVarsNew[6] = {0, 1, 2, 3, 4, 5};
    int Pos = 0;
    if ( t == 0 )
        pBuffer[Pos++] = '0';
    else if ( t == ~(word)0 )
        pBuffer[Pos++] = '1';
    else
        Pos = Dau_DsdPerform_rec( t, pBuffer, Pos, pVarsNew, 6 );
    pBuffer[Pos++] = 0;
//    printf( "%d ", strlen(pBuffer) );
//    printf( "%s ->", pBuffer );
    Dau_DsdRemoveBraces( pBuffer, Dau_DsdComputeMatches(pBuffer) );
//    printf( " %s\n", pBuffer );
    return pBuffer;
}